

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basis_transcode.cpp
# Opt level: O3

ktx_error_code_e
ktxTexture2_transcodeLzEtc1s
          (ktxTexture2 *This,alpha_content_e alphaContent,ktxTexture2 *prototype,
          ktx_transcode_fmt_e outputFormat,ktx_transcode_flags transcodeFlags)

{
  bool is_video;
  ktx_uint32_t kVar1;
  uint32_t alpha_length;
  ktxTexture2_private *pkVar2;
  ushort *puVar3;
  ktxTexture2_private *pkVar4;
  ktx_uint8_t *pkVar5;
  byte bVar6;
  bool bVar7;
  uint32_t orig_width;
  undefined4 *puVar8;
  ktx_uint64_t kVar9;
  ktx_size_t kVar10;
  ktx_uint64_t kVar11;
  long lVar12;
  uint32_t orig_height;
  ulong uVar13;
  ktx_uint32_t kVar14;
  ulong uVar15;
  ulong uVar16;
  size_type __new_size;
  int iVar17;
  uint uVar18;
  ulong uVar19;
  uint32_t *puVar20;
  uint uVar21;
  ktx_error_code_e kVar22;
  undefined1 extraout_var [12];
  undefined1 extraout_var_00 [12];
  undefined1 auVar24 [12];
  undefined1 auVar23 [16];
  ulong local_410;
  vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
  xcoderStates;
  basisu_lowlevel_etc1s_transcoder bit;
  
  if (This->supercompressionScheme != KTX_SS_BASIS_LZ) {
    __assert_fail("This->supercompressionScheme == KTX_SS_BASIS_LZ",
                  "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/basis_transcode.cpp"
                  ,0x1d3,
                  "ktx_error_code_e ktxTexture2_transcodeLzEtc1s(ktxTexture2 *, alpha_content_e, ktxTexture2 *, ktx_transcode_fmt_e, ktx_transcode_flags)"
                 );
  }
  pkVar2 = This->_private;
  puVar3 = (ushort *)pkVar2->_supercompressionGlobalData;
  if (((*(int *)(puVar3 + 2) == 0) || (*(int *)(puVar3 + 4) == 0)) || (*(int *)(puVar3 + 6) == 0)) {
    basisu::debug_printf("ktxTexture_TranscodeBasis: missing endpoints, selectors or tables");
  }
  else {
    pkVar4 = prototype->_private;
    uVar15 = (ulong)This->numLevels;
    uVar21 = This->numLevels + 1;
    puVar8 = (undefined4 *)operator_new__((ulong)uVar21 * 4);
    kVar14 = This->numFaces;
    kVar1 = This->numLayers;
    *puVar8 = 0;
    if (uVar15 != 0) {
      uVar13 = 2;
      if (2 < uVar21) {
        uVar13 = (ulong)uVar21;
      }
      uVar21 = This->baseDepth;
      lVar12 = 0;
      iVar17 = 0;
      do {
        uVar18 = uVar21 >> ((byte)lVar12 & 0x1f);
        iVar17 = iVar17 + (uVar18 + (uVar18 == 0)) * kVar14 * kVar1;
        puVar8[lVar12 + 1] = iVar17;
        lVar12 = lVar12 + 1;
      } while (uVar13 - 1 != lVar12);
    }
    if ((ulong)*(uint *)(puVar3 + 6) +
        (ulong)*(uint *)(puVar3 + 4) +
        (ulong)*(uint *)(puVar3 + 2) + (ulong)(uint)puVar8[uVar15] * 0x14 + 0x14 <=
        pkVar2->_sgdByteLength) {
      basist::basisu_lowlevel_etc1s_transcoder::basisu_lowlevel_etc1s_transcoder(&bit);
      xcoderStates.
      super__Vector_base<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
      ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
      xcoderStates.
      super__Vector_base<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
      ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
      xcoderStates.
      super__Vector_base<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
      ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
      __new_size = 1;
      if (This->isVideo == true) {
        __new_size = (size_type)This->numFaces;
      }
      std::vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
      ::resize(&xcoderStates,__new_size);
      basist::basisu_lowlevel_etc1s_transcoder::decode_palettes
                (&bit,(uint)*puVar3,(uint8_t *)(puVar3 + (ulong)(uint)puVar8[uVar15] * 10 + 10),
                 *(uint *)(puVar3 + 2),(uint)puVar3[1],
                 (uint8_t *)
                 ((long)(puVar3 + (ulong)(uint)puVar8[uVar15] * 10 + 10) +
                 (ulong)*(uint *)(puVar3 + 2)),*(uint32_t *)(puVar3 + 4));
      basist::basisu_lowlevel_etc1s_transcoder::decode_tables
                (&bit,(uint8_t *)
                      ((long)puVar3 +
                      (ulong)*(uint *)(puVar3 + 4) + (ulong)*(uint *)(puVar3 + 2) +
                      (ulong)(uint)puVar8[uVar15] * 0x14 + 0x14),*(uint32_t *)(puVar3 + 6));
      uVar15 = prototype->dataSize;
      uVar13 = (ulong)((prototype->_protected->_formatSize).blockSizeInBits >> 3);
      kVar22 = KTX_SUCCESS;
      uVar21 = This->numLevels - 1;
      if (-1 < (int)uVar21) {
        is_video = This->isVideo;
        pkVar5 = prototype->pData;
        local_410 = 0;
        uVar16 = (ulong)uVar21;
        do {
          kVar14 = (ktx_uint32_t)uVar16;
          kVar9 = ktxTexture2_levelDataOffset(This,kVar14);
          bVar6 = (byte)uVar16;
          uVar21 = This->baseWidth >> (bVar6 & 0x1f);
          orig_width = uVar21 + (uVar21 == 0);
          uVar21 = This->baseHeight >> (bVar6 & 0x1f);
          orig_height = uVar21 + (uVar21 == 0);
          uVar21 = This->baseDepth >> (bVar6 & 0x1f);
          iVar17 = (uVar21 + (uVar21 == 0)) * This->numFaces * This->numLayers;
          uVar21 = puVar8[uVar16];
          kVar10 = ktxTexture2_GetImageSize(prototype,kVar14);
          uVar19 = local_410;
          if (uVar21 < uVar21 + iVar17) {
            kVar11 = ((ulong)(iVar17 - 1) + 1) * kVar10;
            puVar20 = (uint32_t *)(puVar3 + (ulong)uVar21 * 10 + 0x12);
            uVar21 = 0;
            do {
              uVar18 = 0;
              if (((long)xcoderStates.
                         super__Vector_base<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
                         ._M_impl.super__Vector_impl_data._M_finish -
                   (long)xcoderStates.
                         super__Vector_base<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
                         ._M_impl.super__Vector_impl_data._M_start >> 5) * -0xf0f0f0f0f0f0f0f -
                  (ulong)(uVar21 + 1) != 0) {
                uVar18 = uVar21 + 1;
              }
              if (alphaContent == eNone) {
                alpha_length = *puVar20;
              }
              else {
                kVar22 = KTX_FILE_DATA_ERROR;
                if ((puVar20[-1] == 0) || (alpha_length = *puVar20, alpha_length == 0))
                goto LAB_00134ba6;
              }
              bVar7 = basist::basisu_lowlevel_etc1s_transcoder::transcode_image
                                (&bit,outputFormat,pkVar5 + uVar19,
                                 (int)(uVar15 / uVar13) - (int)(local_410 / uVar13),This->pData,
                                 (uint32_t)This->dataSize,orig_width + 3 >> 2,orig_height + 3 >> 2,
                                 orig_width,orig_height,kVar14,puVar20[-3] + (int)kVar9,puVar20[-2],
                                 puVar20[-1] + (int)kVar9,alpha_length,transcodeFlags,
                                 alphaContent != eNone,is_video,0,
                                 xcoderStates.
                                 super__Vector_base<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
                                 ._M_impl.super__Vector_impl_data._M_start + uVar21,0);
              if (!bVar7) {
                kVar22 = KTX_TRANSCODE_FAILED;
                goto LAB_00134b9c;
              }
              uVar19 = uVar19 + kVar10;
              puVar20 = puVar20 + 5;
              iVar17 = iVar17 + -1;
              uVar21 = uVar18;
              auVar24 = extraout_var_00;
            } while (iVar17 != 0);
          }
          else {
            kVar11 = 0;
            auVar24 = extraout_var;
          }
          pkVar4->_levelIndex[uVar16].byteOffset = local_410;
          pkVar4->_levelIndex[uVar16].byteLength = kVar11;
          pkVar4->_levelIndex[uVar16].uncompressedByteLength = kVar11;
          if (kVar11 + local_410 != uVar19) {
            __assert_fail("levelOffsetWrite == writeOffset",
                          "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/lib/basis_transcode.cpp"
                          ,0x27a,
                          "ktx_error_code_e ktxTexture2_transcodeLzEtc1s(ktxTexture2 *, alpha_content_e, ktxTexture2 *, ktx_transcode_fmt_e, ktx_transcode_flags)"
                         );
          }
          if (-1 < (long)uVar19) {
            auVar24 = (undefined1  [12])0x0;
          }
          auVar23._0_4_ = (float)uVar19 / (float)pkVar4->_requiredLevelAlignment;
          auVar23._4_12_ = auVar24;
          auVar23 = roundss(auVar23,auVar23,10);
          local_410 = (long)(auVar23._0_4_ * (float)pkVar4->_requiredLevelAlignment) & 0xffffffff;
          bVar7 = 0 < (long)uVar16;
          uVar16 = uVar16 - 1;
        } while (bVar7);
        kVar22 = KTX_SUCCESS;
      }
LAB_00134b9c:
      operator_delete__(puVar8);
LAB_00134ba6:
      std::vector<basist::basisu_transcoder_state,_std::allocator<basist::basisu_transcoder_state>_>
      ::~vector(&xcoderStates);
      basist::basisu_lowlevel_etc1s_transcoder::~basisu_lowlevel_etc1s_transcoder(&bit);
      return kVar22;
    }
    operator_delete__(puVar8);
  }
  return KTX_FILE_DATA_ERROR;
}

Assistant:

KTX_error_code
ktxTexture2_transcodeLzEtc1s(ktxTexture2* This,
                             alpha_content_e alphaContent,
                             ktxTexture2* prototype,
                             ktx_transcode_fmt_e outputFormat,
                             ktx_transcode_flags transcodeFlags)
{
    DECLARE_PRIVATE(priv, This);
    DECLARE_PRIVATE(protoPriv, prototype);
    KTX_error_code result = KTX_SUCCESS;

    assert(This->supercompressionScheme == KTX_SS_BASIS_LZ);

    uint8_t* bgd = priv._supercompressionGlobalData;
    ktxBasisLzGlobalHeader& bgdh = *reinterpret_cast<ktxBasisLzGlobalHeader*>(bgd);
    if (!(bgdh.endpointsByteLength && bgdh.selectorsByteLength && bgdh.tablesByteLength)) {
        debug_printf("ktxTexture_TranscodeBasis: missing endpoints, selectors or tables");
        return KTX_FILE_DATA_ERROR;
    }

    // Compute some helpful numbers.
    //
    // firstImages contains the indices of the first images for each level to
    // ease finding the correct slice description when iterating from smallest
    // level to largest or when randomly accessing them (t.b.c). The last array
    // entry contains the total number of images, for calculating the offsets
    // of the endpoints, etc.
    uint32_t* firstImages = new uint32_t[This->numLevels+1];

    // Temporary invariant value
    uint32_t layersFaces = This->numLayers * This->numFaces;
    firstImages[0] = 0;
    for (uint32_t level = 1; level <= This->numLevels; level++) {
        // NOTA BENE: numFaces * depth is only reasonable because they can't
        // both be > 1. I.e there are no 3d cubemaps.
        firstImages[level] = firstImages[level - 1]
                           + layersFaces * MAX(This->baseDepth >> (level - 1), 1);
    }
    uint32_t& imageCount = firstImages[This->numLevels];

    if (BGD_TABLES_ADDR(0, bgdh, imageCount) + bgdh.tablesByteLength > priv._sgdByteLength) {
        // Compiler will not allow `goto cleanup;` because "jump bypasses variable initialization."
        // The static initializations below this and before the loop are presumably the issue
        // as the compiler is,presumably, inserting code to destruct those at the end of the
        // function.
        delete[] firstImages;
        return KTX_FILE_DATA_ERROR;
    }
    // FIXME: Do more validation.

    // Prepare low-level transcoder for transcoding slices.
    basist::basisu_lowlevel_etc1s_transcoder bit;

    // basisu_transcoder_state is used to find the previous frame when
    // decoding a video P-Frame. It tracks the previous frame for each mip
    // level. For cube map array textures we need to find the previous frame
    // for each face so we a state per face. Although providing this is only
    // needed for video, it is easier to always pass our own.
    std::vector<basisu_transcoder_state> xcoderStates;
    xcoderStates.resize(This->isVideo ? This->numFaces : 1);

    bit.decode_palettes(bgdh.endpointCount, BGD_ENDPOINTS_ADDR(bgd, imageCount),
                        bgdh.endpointsByteLength,
                        bgdh.selectorCount, BGD_SELECTORS_ADDR(bgd, bgdh, imageCount),
                        bgdh.selectorsByteLength);

    bit.decode_tables(BGD_TABLES_ADDR(bgd, bgdh, imageCount),
                      bgdh.tablesByteLength);

    // Find matching VkFormat and calculate output sizes.

    const bool isVideo = This->isVideo;

    ktx_uint8_t* pXcodedData = prototype->pData;
    // Inconveniently, the output buffer size parameter of transcode_image
    // has to be in pixels for uncompressed output and in blocks for
    // compressed output. The only reason for humouring the API is so
    // its buffer size tests provide a real check. An alternative is to
    // always provide the size in bytes which will always pass.
    ktx_uint32_t outputBlockByteLength
                      = prototype->_protected->_formatSize.blockSizeInBits / 8;
    ktx_size_t xcodedDataLength
                      = prototype->dataSize / outputBlockByteLength;
    ktxLevelIndexEntry* protoLevelIndex;
    uint64_t levelOffsetWrite;
    const ktxBasisLzEtc1sImageDesc* imageDescs = BGD_ETC1S_IMAGE_DESCS(bgd);

    // Finally we're ready to transcode the slices.

    // FIXME: Iframe flag needs to be queryable by the application. In Basis
    // the app can query file_info and image_info from the transcoder which
    // returns a structure with lots of info about the image.

    protoLevelIndex = protoPriv._levelIndex;
    levelOffsetWrite = 0;
    for (int32_t level = This->numLevels - 1; level >= 0; level--) {
        uint64_t levelOffset = ktxTexture2_levelDataOffset(This, level);
        uint64_t writeOffset = levelOffsetWrite;
        uint64_t writeOffsetBlocks = levelOffsetWrite / outputBlockByteLength;
        uint32_t levelWidth = MAX(1, This->baseWidth >> level);
        uint32_t levelHeight = MAX(1, This->baseHeight >> level);
        // ETC1S texel block dimensions
        const uint32_t bw = 4, bh = 4;
        uint32_t levelBlocksX = (levelWidth + (bw - 1)) / bw;
        uint32_t levelBlocksY = (levelHeight + (bh - 1)) / bh;
        uint32_t depth = MAX(1, This->baseDepth >> level);
        //uint32_t faceSlices = This->numFaces == 1 ? depth : This->numFaces;
        uint32_t faceSlices = This->numFaces * depth;
        uint32_t numImages = This->numLayers * faceSlices;
        uint32_t image = firstImages[level];
        uint32_t endImage = image + numImages;
        ktx_size_t levelImageSizeOut, levelSizeOut;
        uint32_t stateIndex = 0;

        levelSizeOut = 0;
        // FIXME: Figure out a way to get the size out of the transcoder.
        levelImageSizeOut = ktxTexture2_GetImageSize(prototype, level);
        for (; image < endImage; image++) {
            const ktxBasisLzEtc1sImageDesc& imageDesc = imageDescs[image];

            basisu_transcoder_state& xcoderState = xcoderStates[stateIndex];
            // We have face0 [face1 ...] within each layer. Use `stateIndex`
            // rather than a double loop of layers and faceSlices as this
            // works for 3d texture and non-array cube maps as well as
            // cube map arrays without special casing.
            if (++stateIndex == xcoderStates.size())
                stateIndex = 0;

            if (alphaContent != eNone)
            {
                // The slice descriptions should have alpha information.
                if (imageDesc.alphaSliceByteOffset == 0
                    || imageDesc.alphaSliceByteLength == 0)
                    return KTX_FILE_DATA_ERROR;
            }

            bool status;
            status = bit.transcode_image(
                      (transcoder_texture_format)outputFormat,
                      pXcodedData + writeOffset,
                      (uint32_t)(xcodedDataLength - writeOffsetBlocks),
                      This->pData,
                      (uint32_t)This->dataSize,
                      levelBlocksX,
                      levelBlocksY,
                      levelWidth,
                      levelHeight,
                      level,
                      (uint32_t)(levelOffset + imageDesc.rgbSliceByteOffset),
                      imageDesc.rgbSliceByteLength,
                      (uint32_t)(levelOffset + imageDesc.alphaSliceByteOffset),
                      imageDesc.alphaSliceByteLength,
                      transcodeFlags,
                      alphaContent != eNone,
                      isVideo,
                      // Our P-Frame flag is in the same bit as
                      // cSliceDescFlagsFrameIsIFrame. We have to
                      // invert it to make it an I-Frame flag.
                      //
                      // API currently doesn't have any way to pass
                      // the I-Frame flag.
                      //imageDesc.imageFlags ^ cSliceDescFlagsFrameIsIFrame,
                      0, // output_row_pitch_in_blocks_or_pixels
                      &xcoderState,
                      0  // output_rows_in_pixels
                      );
            if (!status) {
                result = KTX_TRANSCODE_FAILED;
                goto cleanup;
            }

            writeOffset += levelImageSizeOut;
            levelSizeOut += levelImageSizeOut;
        } // end images loop
        protoLevelIndex[level].byteOffset = levelOffsetWrite;
        protoLevelIndex[level].byteLength = levelSizeOut;
        protoLevelIndex[level].uncompressedByteLength = levelSizeOut;
        levelOffsetWrite += levelSizeOut;
        assert(levelOffsetWrite == writeOffset);
        // In case of transcoding to uncompressed.
        levelOffsetWrite = _KTX_PADN(protoPriv._requiredLevelAlignment,
                                     levelOffsetWrite);
    } // level loop

    result = KTX_SUCCESS;

cleanup:
    delete[] firstImages;
    return result;
}